

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_headers.c
# Opt level: O0

int test_double(void)

{
  __cl_double2 v2;
  cl_double16 b16;
  cl_double8 b8;
  cl_double4 b4;
  cl_double2 b2;
  cl_double b;
  cl_double16 a16;
  cl_double8 a8;
  cl_double4 a4;
  cl_double2 a2;
  cl_double a;
  undefined4 local_300 [2];
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined4 local_280 [2];
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_208;
  undefined1 local_200 [192];
  undefined1 local_140 [96];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  
  local_98 = 0;
  local_b0 = 0;
  local_a8 = 0x3ff0000000000000;
  local_e0 = 0;
  local_d8 = 0x3ff0000000000000;
  local_d0 = 0x4000000000000000;
  local_c8 = 0x4008000000000000;
  memcpy(local_140,&DAT_00104340,0x40);
  memcpy(local_200,&DAT_00104380,0x80);
  local_208 = local_98;
  local_220 = local_b0;
  uStack_218 = local_a8;
  local_240 = local_e0;
  local_238 = local_d8;
  local_230 = local_d0;
  local_228 = local_c8;
  memcpy(local_280,local_140,0x40);
  memcpy(local_300,local_200,0x80);
  printf("\nVerifying assignment:\n");
  printf("b:   %f\n",(int)local_208);
  printf("b2:  %f %f \n",(int)local_220,uStack_218);
  printf("b4:  %f %f %f %f\n",(int)local_240,local_238,local_230,local_228);
  printf("b8:  %f %f %f %f %f %f %f %f\n",local_280[0],local_278,local_270,local_268,local_260,
         local_258,local_250,local_248);
  printf("b16: %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f\n",local_300[0],local_2f8,local_2f0,
         local_2e8,local_2e0,local_2d8,local_2d0,local_2c8);
  printf("\nVerifying vector access:\n");
  printf("__cl_double2:  %f %f \n",(int)local_220,uStack_218);
  printf("__cl_double4 SIMD vectors not supported on this architecture.\n");
  printf("__cl_double8 SIMD vectors not supported on this architecture.\n");
  printf("__cl_double16 SIMD vectors not supported on this architecture.\n");
  printf("\n");
  return 0;
}

Assistant:

int test_double(void)
{
/* double */
    /* Constructor */
    cl_double a = 0.0f;
    cl_double2 a2 = {{ 0.0f, 1.0f }};
    cl_double4 a4 = {{ 0.0f, 1.0f, 2.0f, 3.0f }};
    cl_double8 a8 = {{ 0.0f, 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f, 7.0f }};
    cl_double16 a16 = {{ 0.0f, 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f, 7.0f, 8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f }};

    /* assignment */
    cl_double    b = a;
    cl_double2   b2 = a2;
    cl_double4   b4 = a4;
    cl_double8   b8 = a8;
    cl_double16  b16 = a16;

    printf("\nVerifying assignment:\n" );
    printf("b:   %f\n", b );
    printf("b2:  %f %f \n", b2.s[0], b2.s[1] );
    printf("b4:  %f %f %f %f\n", b4.s[0], b4.s[1], b4.s[2], b4.s[3] );
    printf("b8:  %f %f %f %f %f %f %f %f\n", b8.s[0], b8.s[1], b8.s[2], b8.s[3], b8.s[4], b8.s[5], b8.s[6], b8.s[7] );
    printf("b16: %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f\n", b16.s[0], b16.s[1], b16.s[2], b16.s[3], b16.s[4], b16.s[5], b16.s[6], b16.s[7],
                                                                     b16.s[8], b16.s[9], b16.s[10], b16.s[11], b16.s[12], b16.s[13], b16.s[14], b16.s[15]);

    /* vector access */
    printf("\nVerifying vector access:\n" );
#if defined( __CL_DOUBLE2__ )
    __cl_double2 v2 = b2.v2;
    printf("__cl_double2:  %f %f \n", ((cl_double*)&v2)[0], ((cl_double*)&v2)[1] );
#else
    printf( "__cl_double2 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_DOUBLE4__ )
    __cl_double4 v4 = b4.v4;
    printf("__cl_double4:  %f %f %f %f \n", ((cl_double*)&v4)[0], ((cl_double*)&v4)[1], ((cl_double*)&v4)[2], ((cl_double*)&v4)[3] );
#else
    printf( "__cl_double4 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_DOUBLE8__ )
    __cl_double8 v8 = b8.v8;
    printf("__cl_double8:  %f %f %f %f %f %f %f %f \n", ((cl_double*)&v8)[0], ((cl_double*)&v8)[1], ((cl_double*)&v8)[2], ((cl_double*)&v8)[3], ((cl_double*)&v8)[4], ((cl_double*)&v8)[5], ((cl_double*)&v8)[6], ((cl_double*)&v8)[7] );
#else
    printf( "__cl_double8 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_DOUBLE16__ )
    __cl_double16 v16 = b16.v16;
    printf("__cl_double16: %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f \n", ((cl_double*)&v16)[0], ((cl_double*)&v16)[1], ((cl_double*)&v16)[2], ((cl_double*)&v16)[3], ((cl_double*)&v16)[4], ((cl_double*)&v16)[5], ((cl_double*)&v16)[6], ((cl_double*)&v16)[7],
                                                                      ((cl_double*)&v16)[8], ((cl_double*)&v16)[9], ((cl_double*)&v16)[10], ((cl_double*)&v16)[11], ((cl_double*)&v16)[12], ((cl_double*)&v16)[13], ((cl_double*)&v16)[14], ((cl_double*)&v16)[15]);
#else
    printf( "__cl_double16 SIMD vectors not supported on this architecture.\n" );
#endif

    printf( "\n" );
    return 0;
}